

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O0

void __thiscall
beagle::cpu::EigenDecompositionSquare<double,_1>::updateTransitionMatricesWithModelCategories
          (EigenDecompositionSquare<double,_1> *this,int *eigenIndices,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          double **transitionMatrices,int count)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R9;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long in_stack_00000008;
  int in_stack_00000010;
  int k;
  double sum;
  int j_2;
  int i_1;
  int j_1;
  double expatsinbt;
  double expatcosbt;
  double expat;
  double b;
  int i2;
  int j;
  double tmp;
  int i;
  double *EvalImag;
  double *Eval;
  double *Evec;
  double *Ievc;
  double distance;
  int l;
  int n;
  double edgeLength;
  double *transitionMat;
  int u;
  int local_cc;
  double local_c8;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_8c;
  int local_7c;
  int local_50;
  int local_4c;
  int local_34;
  
  for (local_34 = 0; local_34 < in_stack_00000010; local_34 = local_34 + 1) {
    lVar2 = *(long *)(in_stack_00000008 + (long)*(int *)(in_RDX + (long)local_34 * 4) * 8);
    dVar1 = *(double *)(in_R9 + (long)local_34 * 8);
    local_4c = 0;
    for (local_50 = 0; local_50 < *(int *)(in_RDI + 0x18); local_50 = local_50 + 1) {
      lVar3 = *(long *)(*(long *)(in_RDI + 0x48) + (long)*(int *)(in_RSI + (long)local_50 * 4) * 8);
      lVar4 = *(long *)(*(long *)(in_RDI + 0x40) + (long)*(int *)(in_RSI + (long)local_50 * 4) * 8);
      lVar5 = *(long *)(*(long *)(in_RDI + 8) + (long)*(int *)(in_RSI + (long)local_50 * 4) * 8);
      lVar7 = lVar5 + (long)*(int *)(in_RDI + 0x10) * 8;
      for (local_7c = 0; local_7c < *(int *)(in_RDI + 0x10); local_7c = local_7c + 1) {
        if (((*(byte *)(in_RDI + 0x50) & 1) == 0) ||
           ((dVar8 = *(double *)(lVar7 + (long)local_7c * 8), dVar8 == 0.0 && (!NAN(dVar8))))) {
          dVar8 = exp(*(double *)(lVar5 + (long)local_7c * 8) * dVar1);
          for (local_8c = 0; local_8c < *(int *)(in_RDI + 0x10); local_8c = local_8c + 1) {
            *(double *)
             (*(long *)(in_RDI + 0x28) + (long)(local_7c * *(int *)(in_RDI + 0x10) + local_8c) * 8)
                 = *(double *)(lVar3 + (long)(local_7c * *(int *)(in_RDI + 0x10) + local_8c) * 8) *
                   dVar8;
          }
        }
        else {
          iVar6 = local_7c + 1;
          dVar8 = *(double *)(lVar7 + (long)local_7c * 8);
          dVar9 = exp(*(double *)(lVar5 + (long)local_7c * 8) * dVar1);
          dVar10 = cos(dVar8 * dVar1);
          dVar8 = sin(dVar8 * dVar1);
          for (local_b4 = 0; local_b4 < *(int *)(in_RDI + 0x10); local_b4 = local_b4 + 1) {
            auVar14._8_8_ = 0;
            auVar14._0_8_ = dVar9 * dVar10;
            auVar11._8_8_ = 0;
            auVar11._0_8_ =
                 *(ulong *)(lVar3 + (long)(local_7c * *(int *)(in_RDI + 0x10) + local_b4) * 8);
            auVar17._8_8_ = 0;
            auVar17._0_8_ =
                 dVar9 * dVar8 *
                 *(double *)(lVar3 + (long)(iVar6 * *(int *)(in_RDI + 0x10) + local_b4) * 8);
            auVar11 = vfmadd213sd_fma(auVar11,auVar14,auVar17);
            *(long *)(*(long *)(in_RDI + 0x28) +
                     (long)(local_7c * *(int *)(in_RDI + 0x10) + local_b4) * 8) = auVar11._0_8_;
            auVar15._8_8_ = 0;
            auVar15._0_8_ = dVar9 * dVar10;
            auVar12._8_8_ = 0;
            auVar12._0_8_ =
                 *(ulong *)(lVar3 + (long)(iVar6 * *(int *)(in_RDI + 0x10) + local_b4) * 8);
            auVar18._8_8_ = 0;
            auVar18._0_8_ =
                 -(dVar9 * dVar8 *
                  *(double *)(lVar3 + (long)(local_7c * *(int *)(in_RDI + 0x10) + local_b4) * 8));
            auVar11 = vfmadd213sd_fma(auVar12,auVar15,auVar18);
            *(long *)(*(long *)(in_RDI + 0x28) +
                     (long)(iVar6 * *(int *)(in_RDI + 0x10) + local_b4) * 8) = auVar11._0_8_;
          }
          local_7c = local_7c + 1;
        }
      }
      for (local_b8 = 0; local_b8 < *(int *)(in_RDI + 0x10); local_b8 = local_b8 + 1) {
        for (local_bc = 0; local_bc < *(int *)(in_RDI + 0x10); local_bc = local_bc + 1) {
          local_c8 = 0.0;
          for (local_cc = 0; local_cc < *(int *)(in_RDI + 0x10); local_cc = local_cc + 1) {
            auVar16._8_8_ = 0;
            auVar16._0_8_ =
                 *(ulong *)(lVar4 + (long)(local_b8 * *(int *)(in_RDI + 0x10) + local_cc) * 8);
            auVar13._8_8_ = 0;
            auVar13._0_8_ =
                 *(ulong *)(*(long *)(in_RDI + 0x28) +
                           (long)(local_cc * *(int *)(in_RDI + 0x10) + local_bc) * 8);
            auVar19._8_8_ = 0;
            auVar19._0_8_ = local_c8;
            auVar11 = vfmadd213sd_fma(auVar13,auVar16,auVar19);
            local_c8 = auVar11._0_8_;
          }
          if (local_c8 <= 0.0) {
            *(undefined8 *)(lVar2 + (long)local_4c * 8) = 0;
          }
          else {
            *(double *)(lVar2 + (long)local_4c * 8) = local_c8;
          }
          local_4c = local_4c + 1;
        }
        *(undefined8 *)(lVar2 + (long)local_4c * 8) = 0x3ff0000000000000;
        local_4c = local_4c + 1;
      }
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatricesWithModelCategories(int* eigenIndices,
                                                        const int* probabilityIndices,
                                                        const int* firstDerivativeIndices,
                                                        const int* secondDerivativeIndices,
                                                        const double* edgeLengths,
                                                        REALTYPE** transitionMatrices,
                                                        int count) {

    for (int u = 0; u < count; u++) {
        REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
        const double edgeLength = edgeLengths[u];
        int n = 0;
        for (int l = 0; l < kCategoryCount; l++) {
            const REALTYPE distance = edgeLength;
            const REALTYPE* Ievc = gIMatrices[eigenIndices[l]];
            const REALTYPE* Evec = gEMatrices[eigenIndices[l]];
            const REALTYPE* Eval = gEigenValues[eigenIndices[l]];
            const REALTYPE* EvalImag = Eval + kStateCount;
            for(int i=0; i<kStateCount; i++) {
                if (!isComplex || EvalImag[i] == 0) {
                    const REALTYPE tmp = exp(Eval[i] * distance);
                    for(int j=0; j<kStateCount; j++) {
                        matrixTmp[i*kStateCount+j] = Ievc[i*kStateCount+j] * tmp;
                    }
                } else {
                    // 2 x 2 conjugate block
                    int i2 = i + 1;
                    const REALTYPE b = EvalImag[i];
                    const REALTYPE expat = exp(Eval[i] * distance);
                    const REALTYPE expatcosbt = expat * cos(b * distance);
                    const REALTYPE expatsinbt = expat * sin(b * distance);
                    for(int j=0; j<kStateCount; j++) {
                        matrixTmp[ i*kStateCount+j] = expatcosbt * Ievc[ i*kStateCount+j] +
                                                      expatsinbt * Ievc[i2*kStateCount+j];
                        matrixTmp[i2*kStateCount+j] = expatcosbt * Ievc[i2*kStateCount+j] -
                                                      expatsinbt * Ievc[ i*kStateCount+j];
                    }
                    i++; // processed two conjugate rows
                }
            }

#ifdef DEBUG_COMPLEX
            fprintf(stderr,"[");
                for(int i=0; i<16; i++)
                    fprintf(stderr," %7.5e,",matrixTmp[i]);
                fprintf(stderr,"] -- complex debug\n");
                exit(0);
#endif


            for (int i = 0; i < kStateCount; i++) {
                for (int j = 0; j < kStateCount; j++) {
                    REALTYPE sum = 0.0;
                    for (int k = 0; k < kStateCount; k++)
                        sum += Evec[i*kStateCount+k] * matrixTmp[k*kStateCount+j];
                    if (sum > 0)
                        transitionMat[n] = sum;
                    else
                        transitionMat[n] = 0;
                    n++;
                }
if (T_PAD != 0) {
                transitionMat[n] = 1.0;
                n += T_PAD;
}
            }
        }

        if (DEBUGGING_OUTPUT) {
            int kMatrixSize = kStateCount * kStateCount;
            fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
            for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
                fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
        }
    }
}